

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<int>_>::RegularLink(RegularLink<diy::Bounds<int>_> *this)

{
  undefined8 *in_RDI;
  Registrar<diy::RegularLink<diy::Bounds<int>_>_> *in_stack_ffffffffffffffd0;
  Bounds<int> *this_00;
  
  Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<int>_>_>::Registrar
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR_id_abi_cxx11__002f9bb0;
  *(undefined4 *)(in_RDI + 4) = 0;
  Catch::clara::std::
  map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
  ::map((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         *)0x1f58bb);
  Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x1f58ce);
  this_00 = (Bounds<int> *)(in_RDI + 0xe);
  Bounds<int>::Bounds(this_00,(int)((ulong)in_RDI >> 0x20));
  Bounds<int>::Bounds(this_00,(int)((ulong)in_RDI >> 0x20));
  Catch::clara::std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::vector
            ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)0x1f590b);
  Catch::clara::std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::vector
            ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)0x1f591c);
  Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x1f592d);
  return;
}

Assistant:

RegularLink():
                  dim_(0), core_(0), bounds_(0)               {}